

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DynamicType.cpp
# Opt level: O0

BOOL __thiscall
Js::DynamicObject::CallToPrimitiveFunction
          (DynamicObject *this,Var toPrimitiveFunction,PropertyId propertyId,Var *result,
          ScriptContext *requestContext)

{
  code *pcVar1;
  anon_class_24_3_4fd9d492 implicitCall;
  bool bVar2;
  BOOL BVar3;
  RecyclableObject *pRVar4;
  ThreadContext *this_00;
  Var aValue;
  undefined4 *puVar5;
  JavascriptLibrary *this_01;
  Var aResult;
  ThreadContext *threadContext;
  RecyclableObject *toStringFunction;
  ScriptContext *requestContext_local;
  Var *result_local;
  PropertyId propertyId_local;
  Var toPrimitiveFunction_local;
  DynamicObject *this_local;
  TypeId local_18;
  TypeId typeId;
  
  bVar2 = JavascriptConversion::IsCallable(toPrimitiveFunction);
  if (bVar2) {
    pRVar4 = VarTo<Js::RecyclableObject>(toPrimitiveFunction);
    this_00 = ScriptContext::GetThreadContext(requestContext);
    implicitCall.threadContext = this_00;
    implicitCall.this = this;
    implicitCall.toStringFunction = pRVar4;
    aValue = ThreadContext::
             ExecuteImplicitCall<Js::DynamicObject::CallToPrimitiveFunction(void*,int,void**,Js::ScriptContext*)::__0>
                       (this_00,pRVar4,ImplicitCall_ToPrimitive,implicitCall);
    if (aValue == (Var)0x0) {
      bVar2 = ThreadContext::IsDisableImplicitCall(this_00);
      if (!bVar2) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar5 = 1;
        bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/DynamicType.cpp"
                                    ,0x1d6,"(threadContext->IsDisableImplicitCall())",
                                    "threadContext->IsDisableImplicitCall()");
        if (!bVar2) {
          pcVar1 = (code *)invalidInstructionException();
          (*pcVar1)();
        }
        puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar5 = 0;
      }
      this_01 = ScriptContext::GetLibrary(requestContext);
      pRVar4 = JavascriptLibraryBase::GetNull(&this_01->super_JavascriptLibraryBase);
      *result = pRVar4;
      return 1;
    }
    if (aValue == (Var)0x0) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar5 = 1;
      bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                  ,0x14,"(aValue != nullptr)","GetTypeId aValue is null");
      if (!bVar2) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar5 = 0;
    }
    bVar2 = TaggedInt::Is(aValue);
    if (bVar2) {
      local_18 = TypeIds_FirstNumberType;
    }
    else {
      bVar2 = JavascriptNumber::Is_NoTaggedIntCheck(aValue);
      if (bVar2) {
        local_18 = TypeIds_Number;
      }
      else {
        pRVar4 = UnsafeVarTo<Js::RecyclableObject>(aValue);
        if (pRVar4 == (RecyclableObject *)0x0) {
          AssertCount = AssertCount + 1;
          Throw::LogAssert();
          puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar5 = 1;
          bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                      ,0xb,"(obj != nullptr)","GetTypeId aValue is null");
          if (!bVar2) {
            pcVar1 = (code *)invalidInstructionException();
            (*pcVar1)();
          }
          puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar5 = 0;
        }
        local_18 = RecyclableObject::GetTypeId(pRVar4);
        if ((0x57 < (int)local_18) && (BVar3 = RecyclableObject::IsExternal(pRVar4), BVar3 == 0)) {
          AssertCount = AssertCount + 1;
          Throw::LogAssert();
          puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar5 = 1;
          bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                      ,0xe,"(typeId < TypeIds_Limit || obj->IsExternal())",
                                      "GetTypeId aValue has invalid TypeId");
          if (!bVar2) {
            pcVar1 = (code *)invalidInstructionException();
            (*pcVar1)();
          }
          puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar5 = 0;
        }
      }
    }
    if ((int)local_18 < 10) {
      *result = aValue;
      return 1;
    }
  }
  return 0;
}

Assistant:

BOOL DynamicObject::CallToPrimitiveFunction(Var toPrimitiveFunction, PropertyId propertyId, Var* result, ScriptContext * requestContext)
    {
        if (JavascriptConversion::IsCallable(toPrimitiveFunction))
        {
            RecyclableObject* toStringFunction = VarTo<RecyclableObject>(toPrimitiveFunction);

            ThreadContext * threadContext = requestContext->GetThreadContext();
            Var aResult = threadContext->ExecuteImplicitCall(toStringFunction, ImplicitCall_ToPrimitive, [=]() -> Js::Var
            {
                // Stack object should have a pre-op bail on implicit call.  We shouldn't see them here.
                Assert(!ThreadContext::IsOnStack(this) || threadContext->HasNoSideEffect(toStringFunction));
                return CALL_FUNCTION(threadContext, toStringFunction, CallInfo(CallFlags_Value, 1), this);
            });

            if (!aResult)
            {
                // There was an implicit call and implicit calls are disabled. This would typically cause a bailout.
                Assert(threadContext->IsDisableImplicitCall());
                *result = requestContext->GetLibrary()->GetNull();
                return true;
            }

            if (JavascriptOperators::GetTypeId(aResult) <= TypeIds_LastToPrimitiveType)
            {
                *result = aResult;
                return true;
            }
        }
        return false;
    }